

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkNode.cpp
# Opt level: O2

void __thiscall ForkNode::printOutcomingEdges(ForkNode *this,ostream *ostream)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  string local_70;
  string local_50;
  
  Node::printOutcomingEdges(&this->super_Node,ostream);
  for (p_Var2 = (this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->forkSuccessors_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    Node::dotName_abi_cxx11_(&local_50,&this->super_Node);
    poVar1 = std::operator<<(ostream,(string *)&local_50);
    poVar1 = std::operator<<(poVar1," -> ");
    Node::dotName_abi_cxx11_(&local_70,*(Node **)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    std::operator<<(poVar1," [style=dashed]\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void ForkNode::printOutcomingEdges(ostream &ostream) const {
    Node::printOutcomingEdges(ostream);
    for (const auto &forkSuccessor : forkSuccessors_) {
        ostream << this->dotName() << " -> " << forkSuccessor->dotName()
                << " [style=dashed]\n";
    }
}